

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.h
# Opt level: O2

void __thiscall Assimp::ASE::BaseNode::BaseNode(BaseNode *this,Type _mType,string *name)

{
  vector<aiQuatKey,_std::allocator<aiQuatKey>_> *pvVar1;
  vector<aiVectorKey,_std::allocator<aiVectorKey>_> *pvVar2;
  
  this->mType = _mType;
  std::__cxx11::string::string((string *)&this->mName,(string *)name);
  (this->mParent)._M_dataplus._M_p = (pointer)&(this->mParent).field_2;
  (this->mParent)._M_string_length = 0;
  (this->mParent).field_2._M_local_buf[0] = '\0';
  (this->mTransform).a1 = 1.0;
  (this->mTransform).a2 = 0.0;
  (this->mTransform).a3 = 0.0;
  (this->mTransform).a4 = 0.0;
  (this->mTransform).b1 = 0.0;
  (this->mTransform).b2 = 1.0;
  (this->mTransform).b3 = 0.0;
  (this->mTransform).b4 = 0.0;
  (this->mTransform).c1 = 0.0;
  (this->mTransform).c2 = 0.0;
  (this->mTransform).c3 = 1.0;
  (this->mTransform).c4 = 0.0;
  (this->mTransform).d1 = 0.0;
  (this->mTransform).d2 = 0.0;
  (this->mTransform).d3 = 0.0;
  *(long *)&(this->mTransform).d4 = SUB168(ZEXT416(0x3f800000),0);
  (this->mTargetPosition).y = 0.0;
  (this->mTargetPosition).z = 0.0;
  InheritanceInfo::InheritanceInfo(&this->inherit);
  (this->mAnim).mRotationType = TRACK;
  (this->mAnim).mScalingType = TRACK;
  (this->mAnim).mPositionType = TRACK;
  pvVar1 = &(this->mAnim).akeyRotations;
  (pvVar1->super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar1->super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->mAnim).akeyRotations.super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  pvVar2 = &(this->mAnim).akeyPositions;
  (pvVar2->super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar2->super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mTargetAnim).mPositionType = TRACK;
  pvVar2 = &(this->mAnim).akeyScaling;
  (pvVar2->super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar2->super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->mAnim).akeyScaling.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  pvVar1 = &(this->mTargetAnim).akeyRotations;
  (pvVar1->super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar1->super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->mTargetAnim).akeyRotations.super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  pvVar2 = &(this->mTargetAnim).akeyPositions;
  (pvVar2->super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar2->super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar2 = &(this->mTargetAnim).akeyScaling;
  (pvVar2->super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar2->super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   ((long)&(this->mTargetAnim).akeyScaling.
           super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
           super__Vector_impl_data._M_finish + 1) = (undefined1  [16])0x0;
  (this->mTargetPosition).x = NAN;
  return;
}

Assistant:

BaseNode(Type _mType, const std::string &name)
    : mType         (_mType)
    , mName         (name)
    , mProcessed    (false) {
        // Set mTargetPosition to qnan
        const ai_real qnan = get_qnan();
        mTargetPosition.x = qnan;
    }